

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFCryptoProvider.cc
# Opt level: O1

shared_ptr<QPDFCryptoImpl> QPDFCryptoProvider::getImpl(void)

{
  logic_error *this;
  QPDFCryptoProvider *in_RDI;
  shared_ptr<QPDFCryptoImpl> sVar1;
  
  getInstance();
  if (((getInstance::instance.m.
        super___shared_ptr<QPDFCryptoProvider::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      default_provider)._M_string_length != 0) {
    sVar1 = getImpl_internal(in_RDI,(string *)&getInstance::instance);
    sVar1.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)in_RDI;
    return (shared_ptr<QPDFCryptoImpl>)
           sVar1.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>;
  }
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this,"QPDFCryptoProvider::getImpl called with no default provider.")
  ;
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

std::shared_ptr<QPDFCryptoImpl>
QPDFCryptoProvider::getImpl()
{
    QPDFCryptoProvider& p = getInstance();
    if (p.m->default_provider.empty()) {
        throw std::logic_error("QPDFCryptoProvider::getImpl called with no default provider.");
    }
    return p.getImpl_internal(p.m->default_provider);
}